

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O3

void Unit_Test::fillImage
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  uchar *puVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  ulong uVar6;
  uchar *puVar7;
  uchar *puVar8;
  ulong uVar9;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  uVar2 = image->_rowSize;
  if (height * uVar2 != 0) {
    puVar3 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (ulong)(width * image->_colorCount);
    lVar5 = 0;
    puVar7 = image->_data + (ulong)(x * image->_colorCount) + (ulong)(y * uVar2);
    puVar8 = puVar7 + height * uVar2;
    do {
      if (uVar9 != 0) {
        uVar6 = 0;
        do {
          puVar1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start + lVar5;
          lVar5 = lVar5 + 1;
          puVar7[uVar6] = *puVar1;
          if (lVar5 == (long)puVar3 - (long)puVar4) {
            lVar5 = 0;
          }
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
      puVar7 = puVar7 + uVar2;
    } while (puVar7 != puVar8);
  }
  return;
}

Assistant:

void fillImage( PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                    const std::vector < uint8_t > & value )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );

        const uint32_t rowSize = image.rowSize();
        uint8_t * outputY      = image.data() + y * rowSize + x * image.colorCount();
        const uint8_t * endY   = outputY + rowSize * height;

        width = width * image.colorCount();
        const size_t valueSize = value.size();

        size_t id = 0;

        for ( ; outputY != endY; outputY += rowSize ) {
            uint8_t * outputX    = outputY;
            const uint8_t * endX = outputX + width;

            for( ; outputX != endX; ++outputX ) {
                (*outputX) = value[id++];
                if ( id == valueSize )
                    id = 0;
            }
        }
    }